

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_NetworkAdapter.cpp
# Opt level: O0

size_t axl::io::getMacAddressString(String *string,uchar_t *macAddress,uint_t flags)

{
  size_t sVar1;
  uint in_EDX;
  byte *in_RSI;
  StringBase<char,_axl::sl::StringDetailsBase<char>_> *in_RDI;
  char *local_38;
  char *local_30;
  char *local_28;
  
  if ((in_EDX & 2) == 0) {
    if ((in_EDX & 1) == 0) {
      local_38 = "%02x:%02x:%02x:%02x:%02x:%02x";
    }
    else {
      local_38 = "%02X:%02X:%02X:%02X:%02X:%02X";
    }
    local_30 = local_38;
  }
  else {
    if ((in_EDX & 1) == 0) {
      local_28 = "%08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x";
    }
    else {
      local_28 = "%08X-%04X-%04X-%02X%02X-%02X%02X%02X%02X%02X%02X";
    }
    local_28 = local_28 + 0x18;
    local_30 = local_28;
  }
  sVar1 = sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::format
                    (in_RDI,local_30,(ulong)*in_RSI,(ulong)in_RSI[1],(ulong)in_RSI[2],
                     (ulong)in_RSI[3],(uint)in_RSI[4],(uint)in_RSI[5]);
  return sVar1;
}

Assistant:

size_t
getMacAddressString(
	sl::String* string,
	const uchar_t* macAddress,
	uint_t flags
) {
	return string->format(
		(flags & enc::HexEncodingFlag_NoSpace) ?
			(flags & enc::HexEncodingFlag_UpperCase) ?
				"%02X%02X%02X%02X%02X%02X" :
				"%02x%02x%02x%02x%02x%02x" :
			(flags & enc::HexEncodingFlag_UpperCase) ?
				"%02X:%02X:%02X:%02X:%02X:%02X" :
				"%02x:%02x:%02x:%02x:%02x:%02x",
		macAddress[0],
		macAddress[1],
		macAddress[2],
		macAddress[3],
		macAddress[4],
		macAddress[5]
	);
}